

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

bool __thiscall
SslUdpSocketImpl::CreateServerSide
          (SslUdpSocketImpl *this,char *szIpToWhere,uint16_t sPort,char *szIpToBind)

{
  SslConnection *this_00;
  undefined8 __p;
  bool bVar1;
  _Any_data local_58 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  SslUdpSocketImpl *local_28;
  
  bVar1 = UdpSocketImpl::Create(&this->super_UdpSocketImpl,szIpToWhere,sPort,szIpToBind);
  if (bVar1) {
    std::make_unique<OpenSSLWrapper::SslConnection,OpenSSLWrapper::SslUdpContext&>
              ((SslUdpContext *)local_58);
    __p = local_58[0]._M_unused._0_8_;
    local_58[0]._M_unused._M_object = (void *)0x0;
    std::
    __uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
    ::reset((__uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             *)&this->m_pSslCon,(pointer)__p);
    std::
    unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
    ~unique_ptr((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 *)local_58);
    this_00 = (this->m_pSslCon)._M_t.
              super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
              ._M_t.
              super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
              .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl;
    local_38._M_allocated_capacity = 0x11;
    local_38._8_8_ = 0;
    local_28 = this;
    std::function<void()>::function<std::_Bind<void(BaseSocketImpl::*(SslUdpSocketImpl*))()>,void>
              ((function<void()> *)local_58[0]._M_pod_data,
               (_Bind<void_(BaseSocketImpl::*(SslUdpSocketImpl_*))()> *)&local_38);
    OpenSSLWrapper::SslConnection::SetErrorCb(this_00,(function<void_()> *)local_58);
    std::_Function_base::~_Function_base((_Function_base *)local_58);
    OpenSSLWrapper::SslConnection::SSLSetAcceptState
              ((this->m_pSslCon)._M_t.
               super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
  }
  return bVar1;
}

Assistant:

bool SslUdpSocketImpl::CreateServerSide(const char* const szIpToWhere, const uint16_t sPort, const char* const szIpToBind/* = nullptr*/)
{
    const bool bRet = UdpSocketImpl::Create(szIpToWhere, sPort, szIpToBind);
    if (bRet == true)
    {
        m_pSslCon = make_unique<SslConnection>(m_pUdpCtx);
        m_pSslCon->SetErrorCb(function<void()>(bind(&BaseSocketImpl::Close, this)));

        //SSL_set_info_callback((*m_pSslCon)(), ssl_info_callbackServer);

        m_pSslCon->SSLSetAcceptState();
    }
    return bRet;
}